

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

int __thiscall glslang::TType::computeNumComponents(TType *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  
  if ((this->field_0xb & 8) == 0) {
    iVar2 = (*this->_vptr_TType[7])(this);
    if ((iVar2 == 0xf) || (iVar2 = (*this->_vptr_TType[7])(this), iVar2 == 0x10)) {
      iVar2 = (*this->_vptr_TType[0x25])(this);
      if ((char)iVar2 != '\0') {
        pcVar4 = *(char **)&((this->field_13).referentType)->field_0x8;
        iVar2 = (*this->_vptr_TType[0x25])(this);
        if ((char)iVar2 != '\0') {
          uVar3 = 0;
          do {
            if (pcVar4 == (((this->field_13).referentType)->qualifier).semanticName)
            goto LAB_003f15c4;
            iVar2 = computeNumComponents(*(TType **)pcVar4);
            uVar3 = uVar3 + iVar2;
            pcVar4 = pcVar4 + 0x20;
            iVar2 = (*this->_vptr_TType[0x25])(this);
          } while ((char)iVar2 != '\0');
        }
      }
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    uVar1 = *(uint *)&this->field_0x8;
    uVar3 = uVar1 >> 0xc & 0xf;
    if (uVar3 == 0) {
      uVar3 = uVar1 >> 8 & 0xf;
    }
    else {
      uVar3 = uVar3 * (uVar1 >> 0x10 & 0xf);
    }
  }
  else {
    uVar3 = TSmallArrayVector::getDimSize(&this->typeParameters->arraySizes->sizes,0);
  }
LAB_003f15c4:
  if (this->arraySizes != (TArraySizes *)0x0) {
    iVar2 = TArraySizes::getCumulativeSize(this->arraySizes);
    uVar3 = uVar3 * iVar2;
  }
  return uVar3;
}

Assistant:

int computeNumComponents() const
    {
        uint32_t components = 0;

        if (isCoopVecNV()) {
            components = typeParameters->arraySizes->getDimSize(0);
        } else if (getBasicType() == EbtStruct || getBasicType() == EbtBlock) {
            for (TTypeList::const_iterator tl = getStruct()->begin(); tl != getStruct()->end(); tl++)
                components += ((*tl).type)->computeNumComponents();
        } else if (matrixCols)
            components = matrixCols * matrixRows;
        else
            components = vectorSize;

        if (arraySizes != nullptr) {
            components *= arraySizes->getCumulativeSize();
        }

        return static_cast<int>(components);
    }